

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O3

bool __thiscall
google::protobuf::MessageLite::MergePartialFromCodedStream
          (MessageLite *this,CodedInputStream *input)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  undefined4 extraout_var;
  ZeroCopyCodedInputStream zcis;
  EpsCopyInputStream local_98;
  int local_40;
  undefined4 local_3c;
  DescriptorPool *local_38;
  MessageFactory *pMStack_30;
  ZeroCopyInputStream local_28;
  CodedInputStream *local_20;
  
  local_28._vptr_ZeroCopyInputStream = (_func_int **)&PTR__ZeroCopyInputStream_00673d48;
  local_40 = input->recursion_budget_;
  local_98.aliasing_ = (uintptr_t)input->aliasing_enabled_;
  local_98.buffer_[0x18] = '\0';
  local_98.buffer_[0x19] = '\0';
  local_98.buffer_[0x1a] = '\0';
  local_98.buffer_[0x1b] = '\0';
  local_98.buffer_[0x1c] = '\0';
  local_98.buffer_[0x1d] = '\0';
  local_98.buffer_[0x1e] = '\0';
  local_98.buffer_[0x1f] = '\0';
  local_98.buffer_[8] = '\0';
  local_98.buffer_[9] = '\0';
  local_98.buffer_[10] = '\0';
  local_98.buffer_[0xb] = '\0';
  local_98.buffer_[0xc] = '\0';
  local_98.buffer_[0xd] = '\0';
  local_98.buffer_[0xe] = '\0';
  local_98.buffer_[0xf] = '\0';
  local_98.buffer_[0x10] = '\0';
  local_98.buffer_[0x11] = '\0';
  local_98.buffer_[0x12] = '\0';
  local_98.buffer_[0x13] = '\0';
  local_98.buffer_[0x14] = '\0';
  local_98.buffer_[0x15] = '\0';
  local_98.buffer_[0x16] = '\0';
  local_98.buffer_[0x17] = '\0';
  local_98.zcis_ = (ZeroCopyInputStream *)0x0;
  local_98.buffer_[0] = '\0';
  local_98.buffer_[1] = '\0';
  local_98.buffer_[2] = '\0';
  local_98.buffer_[3] = '\0';
  local_98.buffer_[4] = '\0';
  local_98.buffer_[5] = '\0';
  local_98.buffer_[6] = '\0';
  local_98.buffer_[7] = '\0';
  local_98.last_tag_minus_1_ = 0;
  local_98.overall_limit_ = 0x7fffffff;
  local_3c = 0x80000000;
  local_38 = (DescriptorPool *)0x0;
  pMStack_30 = (MessageFactory *)0x0;
  local_20 = input;
  pcVar3 = internal::EpsCopyInputStream::InitFrom(&local_98,&local_28);
  local_3c = 0;
  local_38 = input->extension_pool_;
  pMStack_30 = input->extension_factory_;
  iVar2 = (*this->_vptr_MessageLite[0xd])(this,pcVar3,&local_98);
  pcVar3 = (char *)CONCAT44(extraout_var,iVar2);
  if (pcVar3 == (char *)0x0) {
LAB_00170287:
    bVar1 = false;
  }
  else {
    if (local_98.next_chunk_ == local_98.buffer_) {
      local_98.size_ = ((int)local_98.buffer_end_ - iVar2) + 0x10;
    }
    else {
      local_98.size_ = ((int)local_98.buffer_end_ - iVar2) + local_98.size_;
    }
    if (0 < local_98.size_) {
      (*(local_98.zcis_)->_vptr_ZeroCopyInputStream[3])();
    }
    if (local_98.last_tag_minus_1_ == 1) {
      input->legitimate_message_end_ = true;
    }
    else {
      if ((local_98.limit_end_ < pcVar3) &&
         ((local_98.next_chunk_ == (char *)0x0 ||
          ((long)local_98.limit_ <
           (long)pcVar3 - CONCAT44(local_98.buffer_end_._4_4_,(int)local_98.buffer_end_)))))
      goto LAB_00170287;
      input->last_tag_ = local_98.last_tag_minus_1_ + 1;
    }
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool MessageLite::MergePartialFromCodedStream(io::CodedInputStream* input) {
  ZeroCopyCodedInputStream zcis(input);
  const char* ptr;
  internal::ParseContext ctx(input->RecursionBudget(), zcis.aliasing_enabled(),
                             &ptr, &zcis);
  // MergePartialFromCodedStream allows terminating the wireformat by 0 or
  // end-group tag. Leaving it up to the caller to verify correct ending by
  // calling LastTagWas on input. We need to maintain this behavior.
  ctx.TrackCorrectEnding();
  ctx.data().pool = input->GetExtensionPool();
  ctx.data().factory = input->GetExtensionFactory();
  ptr = _InternalParse(ptr, &ctx);
  if (PROTOBUF_PREDICT_FALSE(!ptr)) return false;
  ctx.BackUp(ptr);
  if (!ctx.EndedAtEndOfStream()) {
    GOOGLE_DCHECK(ctx.LastTag() != 1);  // We can't end on a pushed limit.
    if (ctx.IsExceedingLimit(ptr)) return false;
    input->SetLastTag(ctx.LastTag());
    return true;
  }
  input->SetConsumed();
  return true;
}